

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O3

void sift_down(int i)

{
  node_pair nVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = heap_size;
  uVar3 = i * 2;
  while( true ) {
    if (iVar2 < (int)uVar3) {
      return;
    }
    uVar5 = iVar2;
    if ((uVar3 != iVar2) &&
       (uVar4 = uVar3 | 1, uVar5 = uVar3,
       hdist[heap[(int)uVar4].node1][heap[(int)uVar4].node2] <=
       hdist[heap[(int)uVar3].node1][heap[(int)uVar3].node2])) {
      uVar5 = uVar4;
    }
    if (hdist[heap[i].node1][heap[i].node2] <= hdist[heap[(int)uVar5].node1][heap[(int)uVar5].node2]
       ) break;
    nVar1 = heap[(int)uVar5];
    heap[(int)uVar5] = heap[i];
    heap[i] = nVar1;
    uVar3 = uVar5 * 2;
    i = uVar5;
  }
  return;
}

Assistant:

void sift_down(int i)
{
  int left, right, j;
  node_pair tmp;

  left = i*2;
  right = left+1;

  while (left <= heap_size) {
    if (left == heap_size || in_heap_order(left, right)) {
      j = left;
    } else {
      j = right;
    }
    if (in_heap_order(j, i)) {
      tmp = heap[j];
      heap[j] = heap[i];
      heap[i] = tmp;
      i = j;
      left = i*2;
      right = left+1;
    } else {
      break;
    }
  }
}